

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::ProcessTryHandler(GlobOpt *this,Instr *instr)

{
  Instr *this_00;
  code *pcVar1;
  IRKind IVar2;
  RegionType RVar3;
  bool bVar4;
  undefined4 *puVar5;
  LabelInstr *pLVar6;
  Region *pRVar7;
  bool local_39;
  BVSparse<Memory::JitArenaAllocator> *writeThroughSymbolsSet;
  Region *tryRegion;
  Instr *instr_local;
  GlobOpt *this_local;
  
  this_00 = instr->m_next;
  IVar2 = IR::Instr::GetKind(this_00);
  local_39 = true;
  if (IVar2 != InstrKindLabel) {
    local_39 = IR::Instr::IsProfiledLabelInstr(this_00);
  }
  if (local_39 != false) {
    pLVar6 = IR::Instr::AsLabelInstr(instr->m_next);
    pRVar7 = IR::LabelInstr::GetRegion(pLVar6);
    RVar3 = Region::GetType(pRVar7);
    if (RVar3 == RegionTypeTry) goto LAB_00587ec3;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x3f88,
                     "(instr->m_next->IsLabelInstr() && instr->m_next->AsLabelInstr()->GetRegion()->GetType() == RegionType::RegionTypeTry)"
                     ,
                     "instr->m_next->IsLabelInstr() && instr->m_next->AsLabelInstr()->GetRegion()->GetType() == RegionType::RegionTypeTry"
                    );
  if (!bVar4) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_00587ec3:
  pLVar6 = IR::Instr::AsLabelInstr(instr->m_next);
  pRVar7 = IR::LabelInstr::GetRegion(pLVar6);
  ToVar(this,pRVar7->writeThroughSymbolsSet,this->currentBlock,(Instr *)0x0);
  return;
}

Assistant:

void
GlobOpt::ProcessTryHandler(IR::Instr* instr)
{
    Assert(instr->m_next->IsLabelInstr() && instr->m_next->AsLabelInstr()->GetRegion()->GetType() == RegionType::RegionTypeTry);

    Region* tryRegion = instr->m_next->AsLabelInstr()->GetRegion();
    BVSparse<JitArenaAllocator> * writeThroughSymbolsSet = tryRegion->writeThroughSymbolsSet;

    ToVar(writeThroughSymbolsSet, this->currentBlock);
}